

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O0

void load256two64(uint16_t *out,uint64_t hi,uint64_t lo,int is_signed)

{
  uint16_t uVar1;
  uint64_t sign;
  int i;
  int is_signed_local;
  uint64_t lo_local;
  uint64_t hi_local;
  uint16_t *out_local;
  
  uVar1 = 0;
  if (is_signed != 0 && (long)hi < 0) {
    uVar1 = 0xffff;
  }
  for (i = 0; i < 4; i = i + 1) {
    out[i] = (uint16_t)(lo >> ((byte)(i << 4) & 0x3f));
  }
  for (i = 4; i < 8; i = i + 1) {
    out[i] = (uint16_t)(hi >> (((char)i + -4) * '\x10' & 0x3fU));
  }
  for (i = 8; i < 0x10; i = i + 1) {
    out[i] = uVar1;
  }
  return;
}

Assistant:

static void load256two64(uint16_t* out, uint64_t hi, uint64_t lo, int is_signed) {
    int i;
    uint64_t sign = is_signed && (hi >> 63) ? UINT64_MAX : 0;
    for (i = 0; i < 4; ++i) {
        out[i] = lo >> (16 * i);
    }
    for (i = 4; i < 8; ++i) {
        out[i] = hi >> (16 * (i - 4));
    }
    for (i = 8; i < 16; ++i) {
        out[i] = sign;
    }
}